

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_math.h
# Opt level: O2

uint crnlib::math::count_trailing_zero_bits(uint v)

{
  int iVar1;
  int i;
  uint uVar2;
  
  uVar2 = 4;
  iVar1 = 0x20;
  while( true ) {
    if ((int)uVar2 < 0) break;
    if ((count_trailing_zero_bits::B[uVar2] & v) != 0) {
      v = v << ((byte)count_trailing_zero_bits::S[uVar2] & 0x1f);
      iVar1 = iVar1 - count_trailing_zero_bits::S[uVar2];
    }
    uVar2 = uVar2 - 1;
  }
  return iVar1 + -1 + (uint)(v == 0);
}

Assistant:

inline uint count_trailing_zero_bits(uint v)
        {
            uint c = 32; // c will be the number of zero bits on the right

            static const unsigned int B[] = { 0x55555555, 0x33333333, 0x0F0F0F0F, 0x00FF00FF, 0x0000FFFF };
            static const unsigned int S[] = { 1, 2, 4, 8, 16 }; // Our Magic Binary Numbers

            for (int i = 4; i >= 0; --i) // unroll for more speed
            {
                if (v & B[i])
                {
                    v <<= S[i];
                    c -= S[i];
                }
            }

            if (v)
            {
                c--;
            }

            return c;
        }